

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator/(RangeValue *this,size_t other)

{
  ulong extraout_RAX;
  ulong uVar1;
  runtime_error *this_00;
  RangeValue RVar2;
  RangeValue retval;
  stringstream ss;
  RangeValue local_1d0;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  RangeValue(&local_1d0);
  uVar1 = extraout_RAX;
  if (this->_isUnbound == false) {
    if (other == 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Dividing range ",0xf);
      ::operator<<(local_190,this);
      std::__ostream_insert<char,std::char_traits<char>>(local_190," by 0.",6);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = this->_val / other;
    local_1d0._isUnbound = false;
    local_1d0._val = uVar1;
  }
  RVar2._1_7_ = (undefined7)(uVar1 >> 8);
  RVar2._isUnbound = local_1d0._isUnbound;
  RVar2._val = local_1d0._val;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator/ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound) {
        if (other == 0) {
            std::stringstream ss;
            ss << "Dividing range " << *this << " by 0.";
            throw std::runtime_error(ss.str());
        }
        retval.set(_val / other);
    }
    return retval;
}